

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O3

void FastPForLib::fastunpack(uint32_t *in,uint64_t *out,uint32_t bit)

{
  switch(bit) {
  case 0:
    __fastunpack0(in,out);
    return;
  case 1:
    __fastunpack1(in,out);
    return;
  case 2:
    __fastunpack2(in,out);
    return;
  case 3:
    __fastunpack3(in,out);
    return;
  case 4:
    __fastunpack4(in,out);
    return;
  case 5:
    __fastunpack5(in,out);
    return;
  case 6:
    __fastunpack6(in,out);
    return;
  case 7:
    __fastunpack7(in,out);
    return;
  case 8:
    __fastunpack8(in,out);
    return;
  case 9:
    __fastunpack9(in,out);
    return;
  case 10:
    __fastunpack10(in,out);
    return;
  case 0xb:
    __fastunpack11(in,out);
    return;
  case 0xc:
    __fastunpack12(in,out);
    return;
  case 0xd:
    __fastunpack13(in,out);
    return;
  case 0xe:
    __fastunpack14(in,out);
    return;
  case 0xf:
    __fastunpack15(in,out);
    return;
  case 0x10:
    __fastunpack16(in,out);
    return;
  case 0x11:
    __fastunpack17(in,out);
    return;
  case 0x12:
    __fastunpack18(in,out);
    return;
  case 0x13:
    __fastunpack19(in,out);
    return;
  case 0x14:
    __fastunpack20(in,out);
    return;
  case 0x15:
    __fastunpack21(in,out);
    return;
  case 0x16:
    __fastunpack22(in,out);
    return;
  case 0x17:
    __fastunpack23(in,out);
    return;
  case 0x18:
    __fastunpack24(in,out);
    return;
  case 0x19:
    __fastunpack25(in,out);
    return;
  case 0x1a:
    __fastunpack26(in,out);
    return;
  case 0x1b:
    __fastunpack27(in,out);
    return;
  case 0x1c:
    __fastunpack28(in,out);
    return;
  case 0x1d:
    __fastunpack29(in,out);
    return;
  case 0x1e:
    __fastunpack30(in,out);
    return;
  case 0x1f:
    __fastunpack31(in,out);
    return;
  case 0x20:
    __fastunpack32(in,out);
    return;
  case 0x21:
    __fastunpack33(in,out);
    return;
  case 0x22:
    __fastunpack34(in,out);
    return;
  case 0x23:
    __fastunpack35(in,out);
    return;
  case 0x24:
    __fastunpack36(in,out);
    return;
  case 0x25:
    __fastunpack37(in,out);
    return;
  case 0x26:
    __fastunpack38(in,out);
    return;
  case 0x27:
    __fastunpack39(in,out);
    return;
  case 0x28:
    __fastunpack40(in,out);
    return;
  case 0x29:
    __fastunpack41(in,out);
    return;
  case 0x2a:
    __fastunpack42(in,out);
    return;
  case 0x2b:
    __fastunpack43(in,out);
    return;
  case 0x2c:
    __fastunpack44(in,out);
    return;
  case 0x2d:
    __fastunpack45(in,out);
    return;
  case 0x2e:
    __fastunpack46(in,out);
    return;
  case 0x2f:
    __fastunpack47(in,out);
    return;
  case 0x30:
    __fastunpack48(in,out);
    return;
  case 0x31:
    __fastunpack49(in,out);
    return;
  case 0x32:
    __fastunpack50(in,out);
    return;
  case 0x33:
    __fastunpack51(in,out);
    return;
  case 0x34:
    __fastunpack52(in,out);
    return;
  case 0x35:
    __fastunpack53(in,out);
    return;
  case 0x36:
    __fastunpack54(in,out);
    return;
  case 0x37:
    __fastunpack55(in,out);
    return;
  case 0x38:
    __fastunpack56(in,out);
    return;
  case 0x39:
    __fastunpack57(in,out);
    return;
  case 0x3a:
    __fastunpack58(in,out);
    return;
  case 0x3b:
    __fastunpack59(in,out);
    return;
  case 0x3c:
    __fastunpack60(in,out);
    return;
  case 0x3d:
    __fastunpack61(in,out);
    return;
  case 0x3e:
    __fastunpack62(in,out);
    return;
  case 0x3f:
    __fastunpack63(in,out);
    return;
  case 0x40:
    __fastunpack64(in,out);
    return;
  default:
    return;
  }
}

Assistant:

inline void fastunpack(const uint32_t *__restrict__ in,
                       uint64_t *__restrict__ out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    __fastunpack0(in, out);
    break;
  case 1:
    __fastunpack1(in, out);
    break;
  case 2:
    __fastunpack2(in, out);
    break;
  case 3:
    __fastunpack3(in, out);
    break;
  case 4:
    __fastunpack4(in, out);
    break;
  case 5:
    __fastunpack5(in, out);
    break;
  case 6:
    __fastunpack6(in, out);
    break;
  case 7:
    __fastunpack7(in, out);
    break;
  case 8:
    __fastunpack8(in, out);
    break;
  case 9:
    __fastunpack9(in, out);
    break;
  case 10:
    __fastunpack10(in, out);
    break;
  case 11:
    __fastunpack11(in, out);
    break;
  case 12:
    __fastunpack12(in, out);
    break;
  case 13:
    __fastunpack13(in, out);
    break;
  case 14:
    __fastunpack14(in, out);
    break;
  case 15:
    __fastunpack15(in, out);
    break;
  case 16:
    __fastunpack16(in, out);
    break;
  case 17:
    __fastunpack17(in, out);
    break;
  case 18:
    __fastunpack18(in, out);
    break;
  case 19:
    __fastunpack19(in, out);
    break;
  case 20:
    __fastunpack20(in, out);
    break;
  case 21:
    __fastunpack21(in, out);
    break;
  case 22:
    __fastunpack22(in, out);
    break;
  case 23:
    __fastunpack23(in, out);
    break;
  case 24:
    __fastunpack24(in, out);
    break;
  case 25:
    __fastunpack25(in, out);
    break;
  case 26:
    __fastunpack26(in, out);
    break;
  case 27:
    __fastunpack27(in, out);
    break;
  case 28:
    __fastunpack28(in, out);
    break;
  case 29:
    __fastunpack29(in, out);
    break;
  case 30:
    __fastunpack30(in, out);
    break;
  case 31:
    __fastunpack31(in, out);
    break;
  case 32:
    __fastunpack32(in, out);
    break;
  case 33:
    __fastunpack33(in, out);
    break;
  case 34:
    __fastunpack34(in, out);
    break;
  case 35:
    __fastunpack35(in, out);
    break;
  case 36:
    __fastunpack36(in, out);
    break;
  case 37:
    __fastunpack37(in, out);
    break;
  case 38:
    __fastunpack38(in, out);
    break;
  case 39:
    __fastunpack39(in, out);
    break;
  case 40:
    __fastunpack40(in, out);
    break;
  case 41:
    __fastunpack41(in, out);
    break;
  case 42:
    __fastunpack42(in, out);
    break;
  case 43:
    __fastunpack43(in, out);
    break;
  case 44:
    __fastunpack44(in, out);
    break;
  case 45:
    __fastunpack45(in, out);
    break;
  case 46:
    __fastunpack46(in, out);
    break;
  case 47:
    __fastunpack47(in, out);
    break;
  case 48:
    __fastunpack48(in, out);
    break;
  case 49:
    __fastunpack49(in, out);
    break;
  case 50:
    __fastunpack50(in, out);
    break;
  case 51:
    __fastunpack51(in, out);
    break;
  case 52:
    __fastunpack52(in, out);
    break;
  case 53:
    __fastunpack53(in, out);
    break;
  case 54:
    __fastunpack54(in, out);
    break;
  case 55:
    __fastunpack55(in, out);
    break;
  case 56:
    __fastunpack56(in, out);
    break;
  case 57:
    __fastunpack57(in, out);
    break;
  case 58:
    __fastunpack58(in, out);
    break;
  case 59:
    __fastunpack59(in, out);
    break;
  case 60:
    __fastunpack60(in, out);
    break;
  case 61:
    __fastunpack61(in, out);
    break;
  case 62:
    __fastunpack62(in, out);
    break;
  case 63:
    __fastunpack63(in, out);
    break;
  case 64:
    __fastunpack64(in, out);
    break;
  default:
    break;
  }
}